

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendstate.c
# Opt level: O2

int quicly_sendstate_lost(quicly_sendstate_t *state,quicly_sendstate_sent_t *args)

{
  ulong end;
  quicly_range_t *pqVar1;
  ulong uVar2;
  int iVar3;
  size_t sVar4;
  long lVar5;
  uint64_t start;
  
  start = args->start;
  end = args->end;
  lVar5 = 0x10;
  sVar4 = 1;
  do {
    if (end <= start) {
LAB_00120bda:
      if (((state->pending).num_ranges != 0) &&
         (((state->pending).ranges)->start < ((state->acked).ranges)->end)) {
        __assert_fail("state->pending.num_ranges == 0 || state->acked.ranges[0].end <= state->pending.ranges[0].start"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/sendstate.c"
                      ,0xac,
                      "int quicly_sendstate_lost(quicly_sendstate_t *, quicly_sendstate_sent_t *)");
      }
      iVar3 = check_amount_of_state(state);
      return iVar3;
    }
    pqVar1 = (state->acked).ranges;
    uVar2 = *(ulong *)((long)pqVar1 + lVar5 + -8);
    if (start <= uVar2) {
      start = uVar2;
    }
    if ((sVar4 == (state->acked).num_ranges) ||
       (uVar2 = *(ulong *)((long)&pqVar1->start + lVar5), end <= uVar2)) {
      if ((start < end) && (iVar3 = quicly_ranges_add(&state->pending,start,end), iVar3 != 0)) {
        return iVar3;
      }
      goto LAB_00120bda;
    }
    if ((start < uVar2) && (iVar3 = quicly_ranges_add(&state->pending,start,uVar2), iVar3 != 0)) {
      return iVar3;
    }
    lVar5 = lVar5 + 0x10;
    sVar4 = sVar4 + 1;
  } while( true );
}

Assistant:

int quicly_sendstate_lost(quicly_sendstate_t *state, quicly_sendstate_sent_t *args)
{
    uint64_t start = args->start, end = args->end;
    size_t acked_slot = 0;
    int ret;

    while (start < end) {
        if (start < state->acked.ranges[acked_slot].end)
            start = state->acked.ranges[acked_slot].end;
        ++acked_slot;
        if (acked_slot == state->acked.num_ranges || end <= state->acked.ranges[acked_slot].start) {
            if (start < end) {
                if ((ret = quicly_ranges_add(&state->pending, start, end)) != 0)
                    return ret;
            }
            goto Exit;
        }
        if (start < state->acked.ranges[acked_slot].start) {
            if ((ret = quicly_ranges_add(&state->pending, start, state->acked.ranges[acked_slot].start)) != 0)
                return ret;
        }
    }

Exit:
    assert(state->pending.num_ranges == 0 || state->acked.ranges[0].end <= state->pending.ranges[0].start);
    return check_amount_of_state(state);
}